

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

char ** cargo_split_commandline(cargo_splitcmd_flags_t flags,char *cmdline,int *argc)

{
  char *pcVar1;
  undefined1 local_58 [8];
  wordexp_t p;
  int ret;
  char **argv;
  int i;
  int *argc_local;
  char *cmdline_local;
  char **ppcStack_10;
  cargo_splitcmd_flags_t flags_local;
  
  if (argc == (int *)0x0) {
    __assert_fail("argc",
                  "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                  ,0x1ae1,
                  "char **cargo_split_commandline(cargo_splitcmd_flags_t, const char *, int *)");
  }
  if (cmdline == (char *)0x0) {
    ppcStack_10 = (char **)0x0;
  }
  else {
    memset(local_58,0,0x18);
    p.we_offs._4_4_ = wordexp(cmdline,(wordexp_t *)local_58,0);
    if (p.we_offs._4_4_ == 0) {
      *argc = local_58._0_4_;
      ppcStack_10 = (char **)_cargo_calloc((long)*argc,8);
      if (ppcStack_10 == (char **)0x0) {
LAB_00113f52:
        p.we_wordv = (char **)0x0;
        wordfree((wordexp_t *)local_58);
        if (ppcStack_10 != (char **)0x0) {
          for (argv._4_4_ = 0; argv._4_4_ < *argc; argv._4_4_ = argv._4_4_ + 1) {
            _cargo_xfree(ppcStack_10 + argv._4_4_);
          }
          _cargo_free(ppcStack_10);
        }
        ppcStack_10 = (char **)0x0;
      }
      else {
        for (argv._4_4_ = 0; (ulong)(long)argv._4_4_ < (ulong)local_58; argv._4_4_ = argv._4_4_ + 1)
        {
          pcVar1 = _cargo_strdup(*(char **)(p.we_wordc + (long)argv._4_4_ * 8));
          ppcStack_10[argv._4_4_] = pcVar1;
          if (pcVar1 == (char *)0x0) goto LAB_00113f52;
        }
        p.we_wordv = (char **)0x0;
        wordfree((wordexp_t *)local_58);
      }
    }
    else {
      ppcStack_10 = (char **)0x0;
    }
  }
  return ppcStack_10;
}

Assistant:

char **cargo_split_commandline(cargo_splitcmd_flags_t flags, const char *cmdline, int *argc)
{
    int i;
    char **argv = NULL;
    assert(argc);

    if (!cmdline)
    {
        CARGODBG(1, "Got NULL input\n");
        return NULL;
    }

    // Posix.
    #ifndef _WIN32
    {
        int ret;
        wordexp_t p;
        memset(&p, 0, sizeof(p));

        // Note! This expands shell variables.
        if ((ret = wordexp(cmdline, &p, 0)))
        {
            CARGODBG(1, "wordexp error %d: '%s'\n", ret, cmdline);
            return NULL;
        }

        *argc = p.we_wordc;

        if (!(argv = _cargo_calloc(*argc, sizeof(char *))))
        {
            CARGODBG(1, "Out of memory!\n");
            goto fail;
        }

        for (i = 0; i < p.we_wordc; i++)
        {
            if (!(argv[i] = _cargo_strdup(p.we_wordv[i])))
            {
                CARGODBG(1, "Out of memory!\n");
                goto fail;
            }
        }

        // wordfree seems to fail to free everything in the wordexp_t struct
        // at least on OSX 10.9.5. This is supposed to help on 10.8.5 at least.
        p.we_offs = 0;
        wordfree(&p);

        return argv;
    fail:
        p.we_offs = 0;
        wordfree(&p);
    }
    #else // WIN32
    {
        // TODO: __getmainargs is an alternative... https://msdn.microsoft.com/en-us/library/ff770599.aspx
        wchar_t **wargs = NULL;
        size_t needed = 0;
        wchar_t *cmdlinew = NULL;
        size_t len = strlen(cmdline) + 1;

        if (!(cmdlinew = _cargo_calloc(len, sizeof(wchar_t))))
        {
            CARGODBG(1, "Out of memory!\n");
            goto fail;
        }

        if (!MultiByteToWideChar(CP_ACP, 0, cmdline, -1, cmdlinew, len))
        {
            CARGODBG(1, "Failed to convert to unicode!\n");
            goto fail;
        }

        if (!(wargs = CommandLineToArgvW(cmdlinew, argc)))
        {
            CARGODBG(1, "Out of memory!\n");
            goto fail;
        }

        if (!(argv = _cargo_calloc(*argc, sizeof(char *))))
        {
            CARGODBG(1, "Out of memory!\n");
            goto fail;
        }

        // Convert from wchar_t * to ANSI char *
        for (i = 0; i < *argc; i++)
        {
            // Get the size needed for the target buffer.
            // CP_ACP = Ansi Codepage.
            needed = WideCharToMultiByte(CP_ACP, 0, wargs[i], -1,
                                        NULL, 0, NULL, NULL);

            if (!(argv[i] = _cargo_malloc(needed)))
            {
                CARGODBG(1, "Out of memory!\n");
                goto fail;
            }

            // Do the conversion.
            needed = WideCharToMultiByte(CP_ACP, 0, wargs[i], -1,
                                        argv[i], needed, NULL, NULL);
        }

        if (wargs) LocalFree(wargs);
        _cargo_xfree(&cmdlinew);
        return argv;

    fail:
        if (wargs) LocalFree(wargs);
        _cargo_xfree(&cmdlinew);
    }
    #endif // WIN32

    if (argv)
    {
        for (i = 0; i < *argc; i++)
        {
            _cargo_xfree(&argv[i]);
        }

        _cargo_free(argv);
    }

    return NULL;
}